

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EcMasterlibMain.cpp
# Opt level: O2

void callbackFct(EC_T_BYTE *pbyPDInPtr,EC_T_BYTE *pbyPDOutPtr)

{
  int iVar1;
  EcMasterlibMain *pEVar2;
  ostream *poVar3;
  uint uVar4;
  unique_lock<std::mutex> lk2;
  
  pEVar2 = ecmasterlib::EcMasterlibMain::instance;
  if (200 < callbackFct::counter) {
    for (uVar4 = 0; (iVar1 = (pEVar2->lockInBuffer).lockCount, iVar1 != 0 && (uVar4 < 100));
        uVar4 = uVar4 + 1) {
      usleep(1);
    }
    if (iVar1 < 1) {
      memcpy(pEVar2->inBuffer,pbyPDInPtr,(long)pEVar2->bufferSize);
    }
    for (uVar4 = 0; (iVar1 = (pEVar2->lockOutBuffer).lockCount, iVar1 != 0 && (uVar4 < 100));
        uVar4 = uVar4 + 1) {
      usleep(1);
    }
    if (iVar1 < 1) {
      memcpy(pbyPDOutPtr,pEVar2->outBuffer,(long)pEVar2->bufferSize);
    }
    if (9999 < callbackFct::counter) goto LAB_00146157;
  }
  callbackFct::counter = callbackFct::counter + 1;
LAB_00146157:
  std::condition_variable::notify_one();
  if (pEVar2->waitForEeros == true) {
    if (callbackFct(unsigned_char*,unsigned_char*)::startedWaitingComunicated == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "waiting--------------------------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar3);
      callbackFct(unsigned_char*,unsigned_char*)::startedWaitingComunicated = '\x01';
    }
    std::unique_lock<std::mutex>::unique_lock(&lk2,&pEVar2->m2);
    std::condition_variable::wait((unique_lock *)&pEVar2->cv2);
    std::unique_lock<std::mutex>::unlock(&lk2);
    std::unique_lock<std::mutex>::~unique_lock(&lk2);
  }
  return;
}

Assistant:

EcMasterlibMain* EcMasterlibMain::getInstance() {
	return instance;
}